

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_belme_gu(REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,
                   REF_DBL re,REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_NODE pRVar5;
  REF_GLOB *pRVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  REF_DBL *pRVar13;
  REF_DBL *pRVar14;
  REF_DBL *pRVar15;
  double *pdVar16;
  undefined8 uVar17;
  uint uVar18;
  uint unaff_EBP;
  long lVar19;
  char *pcVar20;
  REF_DBL *unaff_R12;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  REF_DBL mu;
  REF_DBL mu_t;
  REF_DBL diag_system [12];
  double local_180;
  REF_DBL *local_178;
  REF_RECON_RECONSTRUCTION local_170;
  uint local_16c;
  double *local_168;
  REF_DBL *local_160;
  REF_DBL *local_158;
  double *local_150;
  double local_148;
  double *local_140;
  REF_DBL *local_138;
  REF_GRID local_130;
  double local_128;
  void *local_120;
  long local_118;
  REF_DBL local_110;
  double local_108;
  double local_100;
  REF_DBL *local_f8;
  long local_f0;
  REF_DBL *local_e8;
  REF_DBL *local_e0;
  REF_DBL local_d8;
  REF_DBL local_d0;
  REF_DBL *local_c8;
  undefined8 uStack_c0;
  REF_DBL *local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double local_90;
  double local_88;
  
  pRVar5 = ref_grid->node;
  iVar8 = pRVar5->max;
  local_178 = prim_dual;
  local_170 = reconstruction;
  local_16c = ldim;
  local_138 = metric;
  local_130 = ref_grid;
  local_110 = mach;
  local_d8 = re;
  local_d0 = reference_temp;
  if ((long)iVar8 < 0) {
    bVar7 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xacc,
           "ref_metric_belme_gu","malloc lam of REF_DBL negative");
    unaff_EBP = 1;
  }
  else {
    sVar1 = (long)iVar8 * 8;
    unaff_R12 = (REF_DBL *)malloc(sVar1);
    if (unaff_R12 == (REF_DBL *)0x0) {
      bVar7 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xacc,"ref_metric_belme_gu","malloc lam of REF_DBL NULL");
      unaff_EBP = 2;
      unaff_R12 = (REF_DBL *)0x0;
    }
    else {
      bVar7 = true;
      if (iVar8 != 0) {
        memset(unaff_R12,0,sVar1);
      }
    }
  }
  if (bVar7) {
    uVar9 = pRVar5->max;
    if ((int)uVar9 < 0) {
      bVar7 = false;
      iVar8 = printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xacd,"ref_metric_belme_gu","malloc hess_lam of REF_DBL negative");
      local_e0 = (REF_DBL *)CONCAT44(extraout_var,iVar8);
      unaff_EBP = 1;
    }
    else {
      local_e0 = (REF_DBL *)malloc((ulong)uVar9 * 0x30);
      if (local_e0 == (REF_DBL *)0x0) {
        bVar7 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xacd,"ref_metric_belme_gu","malloc hess_lam of REF_DBL NULL");
        unaff_EBP = 2;
        local_e0 = (REF_DBL *)0x0;
      }
      else {
        bVar7 = true;
        if ((ulong)uVar9 != 0) {
          uVar11 = 1;
          if (1 < (int)(uVar9 * 6)) {
            uVar11 = (ulong)(uVar9 * 6);
          }
          memset(local_e0,0,uVar11 << 3);
        }
      }
    }
    if (bVar7) {
      uVar9 = pRVar5->max;
      if ((int)uVar9 < 0) {
        bVar7 = false;
        iVar8 = printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xace,"ref_metric_belme_gu","malloc grad_lam of REF_DBL negative");
        local_e8 = (REF_DBL *)CONCAT44(extraout_var_00,iVar8);
        unaff_EBP = 1;
      }
      else {
        local_e8 = (REF_DBL *)malloc((ulong)uVar9 * 0x18);
        if (local_e8 == (REF_DBL *)0x0) {
          bVar7 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xace,"ref_metric_belme_gu","malloc grad_lam of REF_DBL NULL");
          unaff_EBP = 2;
          local_e8 = (REF_DBL *)0x0;
        }
        else {
          bVar7 = true;
          if ((ulong)uVar9 != 0) {
            uVar11 = 1;
            if (1 < (int)(uVar9 * 3)) {
              uVar11 = (ulong)(uVar9 * 3);
            }
            memset(local_e8,0,uVar11 << 3);
          }
        }
      }
      if (bVar7) {
        uVar9 = pRVar5->max;
        if ((int)uVar9 < 0) {
          bVar7 = false;
          iVar8 = printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xacf,"ref_metric_belme_gu","malloc sr_lam of REF_DBL negative");
          local_140 = (double *)CONCAT44(extraout_var_01,iVar8);
          unaff_EBP = 1;
        }
        else {
          local_140 = (double *)malloc((ulong)uVar9 * 0x28);
          if (local_140 == (double *)0x0) {
            bVar7 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xacf,"ref_metric_belme_gu","malloc sr_lam of REF_DBL NULL");
            unaff_EBP = 2;
            local_140 = (double *)0x0;
          }
          else {
            bVar7 = true;
            if ((ulong)uVar9 != 0) {
              uVar11 = 1;
              if (1 < (int)(uVar9 * 5)) {
                uVar11 = (ulong)(uVar9 * 5);
              }
              memset(local_140,0,uVar11 << 3);
            }
          }
        }
        if (bVar7) {
          iVar8 = pRVar5->max;
          if ((long)iVar8 < 0) {
            bVar7 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xad0,"ref_metric_belme_gu","malloc u of REF_DBL negative");
            unaff_EBP = 1;
          }
          else {
            sVar1 = (long)iVar8 * 8;
            local_160 = (REF_DBL *)malloc(sVar1);
            if (local_160 == (REF_DBL *)0x0) {
              bVar7 = false;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xad0,"ref_metric_belme_gu","malloc u of REF_DBL NULL");
              unaff_EBP = 2;
              local_160 = (REF_DBL *)0x0;
            }
            else {
              bVar7 = true;
              if (iVar8 != 0) {
                memset(local_160,0,sVar1);
              }
            }
          }
          if (bVar7) {
            uVar11 = (ulong)(uint)pRVar5->max;
            if (pRVar5->max < 0) {
              bVar7 = false;
              iVar8 = printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xad1,"ref_metric_belme_gu","malloc hess_u of REF_DBL negative");
              local_158 = (REF_DBL *)CONCAT44(extraout_var_02,iVar8);
              unaff_EBP = 1;
            }
            else {
              local_158 = (REF_DBL *)malloc(uVar11 * 0x30);
              if (local_158 == (REF_DBL *)0x0) {
                bVar7 = false;
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xad1,"ref_metric_belme_gu","malloc hess_u of REF_DBL NULL");
                unaff_EBP = 2;
                local_158 = (REF_DBL *)0x0;
              }
              else {
                bVar7 = true;
                if (uVar11 != 0) {
                  uVar12 = 1;
                  if (1 < (int)(uVar11 * 6)) {
                    uVar12 = uVar11 * 6 & 0xffffffff;
                  }
                  memset(local_158,0,uVar12 << 3);
                }
              }
            }
            if (bVar7) {
              uVar11 = (ulong)(uint)pRVar5->max;
              if (pRVar5->max < 0) {
                bVar7 = false;
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xad2,"ref_metric_belme_gu","malloc grad_u of REF_DBL negative");
                unaff_EBP = 1;
              }
              else {
                local_f8 = (REF_DBL *)malloc(uVar11 * 0x18);
                if (local_f8 == (REF_DBL *)0x0) {
                  bVar7 = false;
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xad2,"ref_metric_belme_gu","malloc grad_u of REF_DBL NULL");
                  unaff_EBP = 2;
                  local_f8 = (REF_DBL *)0x0;
                }
                else {
                  bVar7 = true;
                  if (uVar11 != 0) {
                    uVar12 = 1;
                    if (1 < (int)(uVar11 * 3)) {
                      uVar12 = uVar11 * 3 & 0xffffffff;
                    }
                    memset(local_f8,0,uVar12 << 3);
                  }
                }
              }
              if (bVar7) {
                uVar11 = (ulong)(uint)pRVar5->max;
                if (pRVar5->max < 0) {
                  bVar7 = false;
                  iVar8 = printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0xad3,"ref_metric_belme_gu","malloc omega of REF_DBL negative");
                  local_120 = (void *)CONCAT44(extraout_var_03,iVar8);
                  unaff_EBP = 1;
                }
                else {
                  local_120 = malloc(uVar11 * 0x48);
                  if (local_120 == (void *)0x0) {
                    bVar7 = false;
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xad3,"ref_metric_belme_gu","malloc omega of REF_DBL NULL");
                    unaff_EBP = 2;
                    local_120 = (void *)0x0;
                  }
                  else {
                    bVar7 = true;
                    if (uVar11 != 0) {
                      uVar12 = 1;
                      if (1 < (int)(uVar11 * 9)) {
                        uVar12 = uVar11 * 9 & 0xffffffff;
                      }
                      memset(local_120,0,uVar12 << 3);
                    }
                  }
                }
                if (bVar7) {
                  local_f0 = (long)(int)local_16c;
                  local_148 = (double)(long)((int)local_16c / 2);
                  pRVar14 = local_178 + (long)local_148;
                  local_118 = local_f0 * 8;
                  local_150 = local_140;
                  lVar21 = 0;
                  local_b0 = unaff_R12;
                  do {
                    iVar8 = pRVar5->max;
                    if (0 < (long)iVar8) {
                      pRVar6 = pRVar5->global;
                      lVar19 = 0;
                      pRVar13 = pRVar14;
                      do {
                        if (-1 < pRVar6[lVar19]) {
                          local_b0[lVar19] = *pRVar13;
                        }
                        lVar19 = lVar19 + 1;
                        pRVar13 = (REF_DBL *)((long)pRVar13 + local_118);
                      } while (iVar8 != lVar19);
                    }
                    local_168 = (double *)lVar21;
                    uVar9 = ref_recon_hessian(local_130,local_b0,local_e0,local_170);
                    if (uVar9 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xad9,"ref_metric_belme_gu",(ulong)uVar9,"hess_lam");
                      return uVar9;
                    }
                    local_c8 = pRVar14;
                    if (0 < pRVar5->max) {
                      lVar21 = 0;
                      pdVar16 = local_150;
                      pRVar14 = local_e0;
                      do {
                        if (-1 < pRVar5->global[lVar21]) {
                          uVar9 = ref_matrix_diag_m(pRVar14,&local_98);
                          if (uVar9 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0xadb,"ref_metric_belme_gu",(ulong)uVar9,"decomp");
                            return uVar9;
                          }
                          dVar22 = local_98;
                          if (local_98 <= -local_98) {
                            dVar22 = -local_98;
                          }
                          dVar23 = local_90;
                          if (local_90 <= -local_90) {
                            dVar23 = -local_90;
                          }
                          if (dVar22 <= dVar23) {
                            dVar22 = dVar23;
                          }
                          dVar23 = local_88;
                          if (local_88 <= -local_88) {
                            dVar23 = -local_88;
                          }
                          if (dVar22 <= dVar23) {
                            dVar22 = dVar23;
                          }
                          *pdVar16 = dVar22;
                        }
                        lVar21 = lVar21 + 1;
                        pRVar14 = pRVar14 + 6;
                        pdVar16 = pdVar16 + 5;
                      } while (lVar21 < pRVar5->max);
                    }
                    lVar21 = (long)local_168 + 1;
                    pRVar14 = local_c8 + 1;
                    local_150 = local_150 + 1;
                  } while (lVar21 != 5);
                  iVar8 = pRVar5->max;
                  if (0 < (long)iVar8) {
                    pRVar6 = pRVar5->global;
                    pRVar14 = local_178 + (long)local_148 + 4;
                    lVar21 = 0;
                    do {
                      if (-1 < pRVar6[lVar21]) {
                        local_b0[lVar21] = *pRVar14;
                      }
                      lVar21 = lVar21 + 1;
                      pRVar14 = (REF_DBL *)((long)pRVar14 + local_118);
                    } while (iVar8 != lVar21);
                  }
                  unaff_EBP = ref_recon_gradient(local_130,local_b0,local_e8,local_170);
                  pRVar14 = local_f8;
                  if (unaff_EBP == 0) {
                    pdVar16 = (double *)((long)local_120 + 0x10);
                    lVar21 = 0;
                    pRVar13 = local_178;
                    do {
                      pRVar13 = pRVar13 + 1;
                      iVar8 = pRVar5->max;
                      if (0 < (long)iVar8) {
                        pRVar6 = pRVar5->global;
                        lVar19 = 0;
                        pRVar15 = pRVar13;
                        do {
                          if (-1 < pRVar6[lVar19]) {
                            local_160[lVar19] = *pRVar15;
                          }
                          lVar19 = lVar19 + 1;
                          pRVar15 = (REF_DBL *)((long)pRVar15 + local_118);
                        } while (iVar8 != lVar19);
                      }
                      local_168 = pdVar16;
                      uVar9 = ref_recon_gradient(local_130,local_160,pRVar14,local_170);
                      if (uVar9 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0xaed,"ref_metric_belme_gu",(ulong)uVar9,"grad_u");
                        return uVar9;
                      }
                      iVar8 = pRVar5->max;
                      if (0 < (long)iVar8) {
                        plVar10 = pRVar5->global;
                        lVar19 = 0;
                        pdVar16 = local_168;
                        do {
                          if (-1 < *plVar10) {
                            dVar22 = *(double *)((long)local_e8 + lVar19 + 8);
                            dVar23 = *(double *)((long)local_e8 + lVar19 + 0x10);
                            dVar24 = *(double *)((long)pRVar14 + lVar19 + 8);
                            dVar2 = *(double *)((long)pRVar14 + lVar19 + 0x10);
                            pdVar16[-2] = dVar24 * dVar23 - dVar22 * dVar2;
                            dVar3 = *(double *)((long)local_e8 + lVar19);
                            dVar4 = *(double *)((long)pRVar14 + lVar19);
                            pdVar16[-1] = dVar2 * dVar3 - dVar23 * dVar4;
                            *pdVar16 = dVar4 * dVar22 - dVar3 * dVar24;
                          }
                          plVar10 = plVar10 + 1;
                          pdVar16 = pdVar16 + 9;
                          lVar19 = lVar19 + 0x18;
                        } while ((long)iVar8 * 0x18 != lVar19);
                      }
                      lVar21 = lVar21 + 1;
                      pdVar16 = local_168 + 3;
                    } while (lVar21 != 3);
                    iVar8 = pRVar5->max;
                    if (0 < (long)iVar8) {
                      pRVar14 = local_178 + 1;
                      pRVar6 = pRVar5->global;
                      lVar21 = 0;
                      do {
                        if (-1 < pRVar6[lVar21]) {
                          local_160[lVar21] = *pRVar14;
                        }
                        lVar21 = lVar21 + 1;
                        pRVar14 = (REF_DBL *)((long)pRVar14 + local_118);
                      } while (iVar8 != lVar21);
                    }
                    unaff_EBP = ref_recon_hessian(local_130,local_160,local_158,local_170);
                    if (unaff_EBP == 0) {
                      uVar9 = pRVar5->max;
                      if (0 < (int)uVar9) {
                        uVar18 = local_16c & 0xfffffffe;
                        local_108 = local_110 / local_d8;
                        local_168 = (double *)((ulong)local_168 & 0xffffffff00000000);
                        lVar21 = 0;
                        do {
                          if (-1 < pRVar5->global[lVar21]) {
                            lVar19 = lVar21 * local_f0;
                            dVar22 = local_178[lVar19 + 1];
                            dVar23 = local_178[lVar19 + 2];
                            if (dVar22 <= -dVar22) {
                              dVar22 = -dVar22;
                            }
                            if (dVar23 <= -dVar23) {
                              dVar23 = -dVar23;
                            }
                            dVar24 = local_178[lVar19 + 3];
                            if (dVar24 <= -dVar24) {
                              dVar24 = -dVar24;
                            }
                            local_100 = local_140[lVar21 * 5 + 1] * 20.0;
                            local_148 = local_140[lVar21 * 5 + 2];
                            local_150 = (double *)local_140[lVar21 * 5 + 3];
                            local_c8 = (REF_DBL *)
                                       ((dVar24 + dVar24 + dVar22 * 20.0 + dVar23 + dVar23) *
                                       local_140[lVar21 * 5 + 4]);
                            uStack_c0 = 0;
                            local_a8 = *(double *)((long)local_120 + lVar21 * 0x48 + 0x38) -
                                       *(double *)((long)local_120 + lVar21 * 0x48 + 0x28);
                            if (local_a8 <= -local_a8) {
                              local_a8 = -local_a8;
                            }
                            local_a8 = local_a8 * 1.6666666666666667;
                            uStack_a0 = 0;
                            uVar9 = viscosity_law((local_178[lVar19 + 4] * 1.4) / local_178[lVar19],
                                                  local_d0,&local_180);
                            if (uVar9 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0xb08,"ref_metric_belme_gu",(ulong)uVar9,"sutherlands");
                              return uVar9;
                            }
                            if (uVar18 == 0xc) {
                              uVar9 = ref_phys_mut_sa(local_178[lVar19 + 5],local_178[lVar19],
                                                      local_180 / local_178[lVar19],&local_128);
                              if (uVar9 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                       ,0xb0c,"ref_metric_belme_gu",(ulong)uVar9,"eddy viscosity");
                                return uVar9;
                              }
                              local_180 = local_128 + local_180;
                            }
                            dVar22 = local_180 * local_108 *
                                     (local_a8 +
                                     (double)local_c8 +
                                     (double)local_150 + (double)local_150 +
                                     local_148 + local_148 + local_100 + 0.0);
                            if (dVar22 < 0.0) {
                              pcVar20 = "negative weight u1";
                              uVar17 = 0xb10;
                              goto LAB_001c2c9c;
                            }
                            uVar11 = (ulong)((uint)local_168 & 0x7fffffff);
                            lVar19 = 0;
                            do {
                              local_138[uVar11 * 2 + lVar19] =
                                   local_158[uVar11 * 2 + lVar19] * dVar22 +
                                   local_138[uVar11 * 2 + lVar19];
                              lVar19 = lVar19 + 1;
                            } while (lVar19 != 6);
                            uVar9 = ref_matrix_healthy_m(local_138 + lVar21 * 6);
                            if (uVar9 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0xb14,"ref_metric_belme_gu",(ulong)uVar9,"u1");
                              return uVar9;
                            }
                          }
                          lVar21 = lVar21 + 1;
                          uVar9 = pRVar5->max;
                          local_168 = (double *)CONCAT44(local_168._4_4_,(uint)local_168 + 3);
                        } while (lVar21 < (int)uVar9);
                      }
                      if (0 < (int)uVar9) {
                        pRVar14 = local_178 + 2;
                        pRVar6 = pRVar5->global;
                        uVar11 = 0;
                        do {
                          if (-1 < pRVar6[uVar11]) {
                            local_160[uVar11] = *pRVar14;
                          }
                          uVar11 = uVar11 + 1;
                          pRVar14 = (REF_DBL *)((long)pRVar14 + local_118);
                        } while (uVar9 != uVar11);
                      }
                      unaff_EBP = ref_recon_hessian(local_130,local_160,local_158,local_170);
                      if (unaff_EBP == 0) {
                        uVar9 = pRVar5->max;
                        if (0 < (int)uVar9) {
                          uVar18 = local_16c & 0xfffffffe;
                          local_108 = local_110 / local_d8;
                          local_168 = (double *)((ulong)local_168 & 0xffffffff00000000);
                          lVar21 = 0;
                          do {
                            if (-1 < pRVar5->global[lVar21]) {
                              lVar19 = lVar21 * local_f0;
                              dVar22 = local_178[lVar19 + 1];
                              dVar23 = local_178[lVar19 + 2];
                              if (dVar22 <= -dVar22) {
                                dVar22 = -dVar22;
                              }
                              if (dVar23 <= -dVar23) {
                                dVar23 = -dVar23;
                              }
                              dVar24 = local_178[lVar19 + 3];
                              if (dVar24 <= -dVar24) {
                                dVar24 = -dVar24;
                              }
                              local_100 = local_140[lVar21 * 5 + 1];
                              local_150 = (double *)local_140[lVar21 * 5 + 3];
                              local_148 = local_140[lVar21 * 5 + 2] * 20.0;
                              local_c8 = (REF_DBL *)
                                         ((dVar24 + dVar24 + dVar22 + dVar22 + dVar23 * 20.0) *
                                         local_140[lVar21 * 5 + 4]);
                              uStack_c0 = 0;
                              local_a8 = *(double *)((long)local_120 + lVar21 * 0x48 + 0x10) -
                                         *(double *)((long)local_120 + lVar21 * 0x48 + 0x30);
                              if (local_a8 <= -local_a8) {
                                local_a8 = -local_a8;
                              }
                              local_a8 = local_a8 * 1.6666666666666667;
                              uStack_a0 = 0;
                              uVar9 = viscosity_law((local_178[lVar19 + 4] * 1.4) /
                                                    local_178[lVar19],local_d0,&local_180);
                              if (uVar9 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                       ,0xb2b,"ref_metric_belme_gu",(ulong)uVar9,"sutherlands");
                                return uVar9;
                              }
                              if (uVar18 == 0xc) {
                                uVar9 = ref_phys_mut_sa(local_178[lVar19 + 5],local_178[lVar19],
                                                        local_180 / local_178[lVar19],&local_128);
                                if (uVar9 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                         ,0xb2f,"ref_metric_belme_gu",(ulong)uVar9,"eddy viscosity")
                                  ;
                                  return uVar9;
                                }
                                local_180 = local_128 + local_180;
                              }
                              dVar22 = local_180 * local_108 *
                                       (local_a8 +
                                       (double)local_c8 +
                                       (double)local_150 + (double)local_150 +
                                       local_148 + local_100 + local_100 + 0.0);
                              if (dVar22 < 0.0) {
                                pcVar20 = "negative weight u2";
                                uVar17 = 0xb33;
                                goto LAB_001c2c9c;
                              }
                              uVar11 = (ulong)((uint)local_168 & 0x7fffffff);
                              lVar19 = 0;
                              do {
                                local_138[uVar11 * 2 + lVar19] =
                                     local_158[uVar11 * 2 + lVar19] * dVar22 +
                                     local_138[uVar11 * 2 + lVar19];
                                lVar19 = lVar19 + 1;
                              } while (lVar19 != 6);
                              uVar9 = ref_matrix_healthy_m(local_138 + lVar21 * 6);
                              if (uVar9 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                       ,0xb37,"ref_metric_belme_gu",(ulong)uVar9,"u2");
                                return uVar9;
                              }
                            }
                            lVar21 = lVar21 + 1;
                            uVar9 = pRVar5->max;
                            local_168 = (double *)CONCAT44(local_168._4_4_,(uint)local_168 + 3);
                          } while (lVar21 < (int)uVar9);
                        }
                        if (0 < (int)uVar9) {
                          pRVar14 = local_178 + 3;
                          pRVar6 = pRVar5->global;
                          uVar11 = 0;
                          do {
                            if (-1 < pRVar6[uVar11]) {
                              local_160[uVar11] = *pRVar14;
                            }
                            uVar11 = uVar11 + 1;
                            pRVar14 = (REF_DBL *)((long)pRVar14 + local_118);
                          } while (uVar9 != uVar11);
                        }
                        unaff_EBP = ref_recon_hessian(local_130,local_160,local_158,local_170);
                        if (unaff_EBP == 0) {
                          uVar9 = pRVar5->max;
                          if (0 < (int)uVar9) {
                            uVar18 = local_16c & 0xfffffffe;
                            local_108 = local_110 / local_d8;
                            local_168 = (double *)((ulong)local_168 & 0xffffffff00000000);
                            lVar21 = 0;
                            do {
                              if (-1 < pRVar5->global[lVar21]) {
                                lVar19 = lVar21 * local_f0;
                                dVar22 = local_178[lVar19 + 1];
                                dVar23 = local_178[lVar19 + 2];
                                if (dVar22 <= -dVar22) {
                                  dVar22 = -dVar22;
                                }
                                if (dVar23 <= -dVar23) {
                                  dVar23 = -dVar23;
                                }
                                dVar24 = local_178[lVar19 + 3];
                                if (dVar24 <= -dVar24) {
                                  dVar24 = -dVar24;
                                }
                                local_100 = local_140[lVar21 * 5 + 1];
                                local_148 = local_140[lVar21 * 5 + 2];
                                local_150 = (double *)(local_140[lVar21 * 5 + 3] * 20.0);
                                local_c8 = (REF_DBL *)
                                           ((dVar24 * 20.0 + dVar22 + dVar22 + dVar23 + dVar23) *
                                           local_140[lVar21 * 5 + 4]);
                                uStack_c0 = 0;
                                local_a8 = *(double *)((long)local_120 + lVar21 * 0x48 + 0x18) -
                                           *(double *)((long)local_120 + lVar21 * 0x48 + 8);
                                if (local_a8 <= -local_a8) {
                                  local_a8 = -local_a8;
                                }
                                local_a8 = local_a8 * 1.6666666666666667;
                                uStack_a0 = 0;
                                uVar9 = viscosity_law((local_178[lVar19 + 4] * 1.4) /
                                                      local_178[lVar19],local_d0,&local_180);
                                if (uVar9 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                         ,0xb4e,"ref_metric_belme_gu",(ulong)uVar9,"sutherlands");
                                  return uVar9;
                                }
                                if (uVar18 == 0xc) {
                                  uVar9 = ref_phys_mut_sa(local_178[lVar19 + 5],local_178[lVar19],
                                                          local_180 / local_178[lVar19],&local_128);
                                  if (uVar9 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                           ,0xb52,"ref_metric_belme_gu",(ulong)uVar9,
                                           "eddy viscosity");
                                    return uVar9;
                                  }
                                  local_180 = local_128 + local_180;
                                }
                                dVar22 = local_180 * local_108 *
                                         (local_a8 +
                                         (double)local_c8 +
                                         (double)local_150 +
                                         local_148 + local_148 + local_100 + local_100 + 0.0);
                                if (dVar22 < 0.0) {
                                  pcVar20 = "negative weight u2";
                                  uVar17 = 0xb56;
LAB_001c2c9c:
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                         ,uVar17,"ref_metric_belme_gu",pcVar20);
                                  return 1;
                                }
                                uVar11 = (ulong)((uint)local_168 & 0x7fffffff);
                                lVar19 = 0;
                                do {
                                  local_138[uVar11 * 2 + lVar19] =
                                       local_158[uVar11 * 2 + lVar19] * dVar22 +
                                       local_138[uVar11 * 2 + lVar19];
                                  lVar19 = lVar19 + 1;
                                } while (lVar19 != 6);
                                uVar9 = ref_matrix_healthy_m(local_138 + lVar21 * 6);
                                if (uVar9 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                         ,0xb5a,"ref_metric_belme_gu",(ulong)uVar9,"u3");
                                  return uVar9;
                                }
                              }
                              lVar21 = lVar21 + 1;
                              uVar9 = pRVar5->max;
                              local_168 = (double *)CONCAT44(local_168._4_4_,(uint)local_168 + 3);
                            } while (lVar21 < (int)uVar9);
                          }
                          if (0 < (int)uVar9) {
                            pRVar6 = pRVar5->global;
                            pdVar16 = local_178 + 4;
                            uVar11 = 0;
                            do {
                              if (-1 < pRVar6[uVar11]) {
                                local_160[uVar11] = (*pdVar16 * 1.4) / pdVar16[-4];
                              }
                              uVar11 = uVar11 + 1;
                              pdVar16 = (double *)((long)pdVar16 + local_118);
                            } while (uVar9 != uVar11);
                          }
                          unaff_EBP = ref_recon_hessian(local_130,local_160,local_158,local_170);
                          if (unaff_EBP == 0) {
                            if (0 < pRVar5->max) {
                              local_16c = local_16c & 0xfffffffe;
                              local_110 = (local_110 * 18.0) / local_d8;
                              uVar9 = 0;
                              lVar21 = 0;
                              do {
                                if (-1 < pRVar5->global[lVar21]) {
                                  lVar19 = lVar21 * local_f0;
                                  uVar18 = viscosity_law((local_178[lVar19 + 4] * 1.4) /
                                                         local_178[lVar19],local_d0,&local_180);
                                  if (uVar18 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                           ,0xb64,"ref_metric_belme_gu",(ulong)uVar18,"sutherlands")
                                    ;
                                    return uVar18;
                                  }
                                  dVar22 = local_180 / 0.2879999999999999;
                                  if (local_16c == 0xc) {
                                    uVar18 = ref_phys_mut_sa(local_178[lVar19 + 5],local_178[lVar19]
                                                             ,local_180 / local_178[lVar19],
                                                             &local_128);
                                    if (uVar18 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                             ,0xb69,"ref_metric_belme_gu",(ulong)uVar18,
                                             "eddy viscosity");
                                      return uVar18;
                                    }
                                    dVar22 = local_180 / 0.2879999999999999;
                                    local_180 = local_180 + local_128;
                                    dVar22 = local_128 / 0.35999999999999993 + dVar22;
                                  }
                                  uVar11 = (ulong)(uVar9 & 0x7fffffff);
                                  dVar23 = local_140[lVar21 * 5 + 4];
                                  lVar19 = 0;
                                  do {
                                    local_138[uVar11 * 2 + lVar19] =
                                         local_158[uVar11 * 2 + lVar19] *
                                         dVar22 * local_110 * dVar23 +
                                         local_138[uVar11 * 2 + lVar19];
                                    lVar19 = lVar19 + 1;
                                  } while (lVar19 != 6);
                                }
                                lVar21 = lVar21 + 1;
                                uVar9 = uVar9 + 3;
                              } while (lVar21 < pRVar5->max);
                            }
                            if (local_120 != (void *)0x0) {
                              free(local_120);
                            }
                            if (local_f8 != (REF_DBL *)0x0) {
                              free(local_f8);
                            }
                            if (local_158 != (REF_DBL *)0x0) {
                              free(local_158);
                            }
                            if (local_160 != (REF_DBL *)0x0) {
                              free(local_160);
                            }
                            if (local_140 != (double *)0x0) {
                              free(local_140);
                            }
                            if (local_e8 != (REF_DBL *)0x0) {
                              free(local_e8);
                            }
                            if (local_e0 != (REF_DBL *)0x0) {
                              free(local_e0);
                            }
                            unaff_EBP = 0;
                            if (local_b0 != (REF_DBL *)0x0) {
                              free(local_b0);
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0xb61,"ref_metric_belme_gu",(ulong)unaff_EBP,"hess_u");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0xb41,"ref_metric_belme_gu",(ulong)unaff_EBP,"hess_u");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0xb1e,"ref_metric_belme_gu",(ulong)unaff_EBP,"hess_u");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xafb,"ref_metric_belme_gu",(ulong)unaff_EBP,"hess_u");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xae6,"ref_metric_belme_gu",(ulong)unaff_EBP,"grad_u");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return unaff_EBP;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gu(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i, dir;
  REF_INT nequ;
  REF_DBL *lam, *hess_lam, *grad_lam, *sr_lam, *u, *hess_u, *grad_u;
  REF_DBL *omega;
  REF_DBL u1, u2, u3;
  REF_DBL w1, w2, w3;
  REF_DBL diag_system[12];
  REF_DBL weight;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_lam, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sr_lam, 5 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(u, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_u, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_u, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(omega, 9 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_hessian(ref_grid, lam, hess_lam, reconstruction), "hess_lam");
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_matrix_diag_m(&(hess_lam[6 * node]), diag_system), "decomp");
      sr_lam[var + 5 * node] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                                       ABS(ref_matrix_eig(diag_system, 1))),
                                   ABS(ref_matrix_eig(diag_system, 2)));
    }
  } /* SR MAX (eig, min(1e-30*max(det^-1/3)) for all lambda of var */

  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction), "grad_u");

  for (dir = 0; dir < 3; dir++) {
    var = 1 + dir;
    each_ref_node_valid_node(ref_node, node) {
      u[node] = prim_dual[var + 0 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, u, grad_u, reconstruction), "grad_u");
    each_ref_node_valid_node(ref_node, node) {
      ref_math_cross_product(&(grad_u[3 * node]), &(grad_lam[3 * node]),
                             &(omega[3 * dir + 9 * node]));
    }
  }

  var = 1;
  w1 = 20.0;
  w2 = 2.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + 0 * nequ + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[1 + 2 * 3 + 9 * node] - omega[2 + 1 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u1");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u1");
  }

  var = 2;
  w1 = 2.0;
  w2 = 20.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[2 + 0 * 3 + 9 * node] - omega[0 + 2 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u2");
  }

  var = 3;
  w1 = 2.0;
  w2 = 2.0;
  w3 = 20.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[0 + 1 * 3 + 9 * node] - omega[1 + 0 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u3");
  }

  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    u[node] = t;
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += 18.0 * mach / re * thermal_conductivity *
                              sr_lam[4 + 5 * node] * hess_u[i + 6 * node];
    }
  }

  ref_free(omega);
  ref_free(grad_u);
  ref_free(hess_u);
  ref_free(u);
  ref_free(sr_lam);
  ref_free(grad_lam);
  ref_free(hess_lam);
  ref_free(lam);

  return REF_SUCCESS;
}